

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

void __thiscall
draco::PointCloud::ApplyPointIdDeduplication
          (PointCloud *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
          *id_map,vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *unique_point_ids)

{
  bool bVar1;
  int32_t iVar2;
  reference pIVar3;
  const_reference pvVar4;
  int32_t a_1;
  int32_t a;
  PointIndex new_point_id;
  PointIndex i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *__range1;
  int32_t num_unique_points;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  int att_id;
  PointCloud *in_stack_ffffffffffffff90;
  int local_58;
  int local_48;
  uint local_44;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_40;
  uint local_3c;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> *local_38;
  __normal_iterator<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  local_30 [2];
  uint local_1c;
  
  local_1c = 0;
  local_30[0]._M_current =
       (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
       std::
       vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
       ::begin((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38 = (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
             std::
             vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             ::end((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)), bVar1
        ) {
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
             ::operator*(local_30);
    local_3c = pIVar3->value_;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                           *)in_stack_ffffffffffffff90,
                          (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_40.value_ = pvVar4->value_;
    local_44 = local_1c;
    bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator>=(&local_40,&local_44);
    if (bVar1) {
      for (local_48 = 0; iVar2 = num_attributes((PointCloud *)0x1c7894), local_48 < iVar2;
          local_48 = local_48 + 1) {
        in_stack_ffffffffffffff90 =
             (PointCloud *)attribute(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        attribute(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        PointAttribute::mapped_index
                  ((PointAttribute *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (PointIndex)(uint)in_stack_ffffffffffffff90);
        PointAttribute::SetPointMapEntry
                  ((PointAttribute *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (PointIndex)(uint)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (AttributeValueIndex)(uint)in_stack_ffffffffffffff90);
      }
      local_1c = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(&local_40);
      local_1c = local_1c + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
    ::operator++(local_30);
  }
  local_58 = 0;
  while (att_id = local_58, iVar2 = num_attributes((PointCloud *)0x1c793a), att_id < iVar2) {
    attribute(in_stack_ffffffffffffff90,att_id);
    PointAttribute::SetExplicitMapping
              ((PointAttribute *)in_stack_ffffffffffffff90,
               CONCAT44(att_id,in_stack_ffffffffffffff88));
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void PointCloud::ApplyPointIdDeduplication(
    const IndexTypeVector<PointIndex, PointIndex> &id_map,
    const std::vector<PointIndex> &unique_point_ids) {
  int32_t num_unique_points = 0;
  for (PointIndex i : unique_point_ids) {
    const PointIndex new_point_id = id_map[i];
    if (new_point_id >= num_unique_points) {
      // New unique vertex reached. Copy attribute indices to the proper
      // position.
      for (int32_t a = 0; a < num_attributes(); ++a) {
        attribute(a)->SetPointMapEntry(new_point_id,
                                       attribute(a)->mapped_index(i));
      }
      num_unique_points = new_point_id.value() + 1;
    }
  }
  for (int32_t a = 0; a < num_attributes(); ++a) {
    attribute(a)->SetExplicitMapping(num_unique_points);
  }
}